

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::Array2D<float>::Array2D<float_const*,void>
          (Array2D<float> *this,float *first,float *last,int nx,int ny,allocator_type allocator)

{
  allocator_type in_RDI;
  Point2<int> *pPVar1;
  Point2<int> *in_stack_ffffffffffffff70;
  Bounds2i *extent;
  Array2D<float> *this_00;
  Bounds2i local_48;
  Array2D<float> local_38;
  
  pPVar1 = &local_48.pMax;
  Point2<int>::Point2(in_stack_ffffffffffffff70,(int)((ulong)pPVar1 >> 0x20),(int)pPVar1);
  extent = &local_48;
  Point2<int>::Point2(&extent->pMin,(int)((ulong)pPVar1 >> 0x20),(int)pPVar1);
  this_00 = &local_38;
  Bounds2<int>::Bounds2((Bounds2<int> *)in_RDI.memoryResource,(Point2<int> *)this_00,&extent->pMin);
  Array2D(this_00,extent,in_RDI);
  begin((Array2D<float> *)in_RDI.memoryResource);
  std::copy<float_const*,float*>((float *)in_RDI.memoryResource,(float *)this_00,(float *)extent);
  return;
}

Assistant:

Array2D(InputIt first, InputIt last, int nx, int ny, allocator_type allocator = {})
        : Array2D({{0, 0}, {nx, ny}}, allocator) {
        std::copy(first, last, begin());
    }